

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3TableLock(Parse *pParse,int iDb,int iTab,u8 isWriteLock,char *zName)

{
  int iVar1;
  TableLock *pTVar2;
  bool local_49;
  Parse *local_48;
  TableLock *p;
  int nBytes;
  int i;
  Parse *pToplevel;
  char *zName_local;
  u8 isWriteLock_local;
  int iTab_local;
  int iDb_local;
  Parse *pParse_local;
  
  local_48 = pParse;
  if (pParse->pToplevel != (Parse *)0x0) {
    local_48 = pParse->pToplevel;
  }
  if ((iDb != 1) && (iVar1 = sqlite3BtreeSharable(pParse->db->aDb[iDb].pBt), iVar1 != 0)) {
    for (p._4_4_ = 0; p._4_4_ < local_48->nTableLock; p._4_4_ = p._4_4_ + 1) {
      pTVar2 = local_48->aTableLock + p._4_4_;
      if ((pTVar2->iDb == iDb) && (pTVar2->iTab == iTab)) {
        local_49 = pTVar2->isWriteLock != '\0' || isWriteLock != '\0';
        pTVar2->isWriteLock = local_49;
        return;
      }
    }
    pTVar2 = (TableLock *)
             sqlite3DbReallocOrFree
                       (local_48->db,local_48->aTableLock,(long)((local_48->nTableLock + 1) * 0x18))
    ;
    local_48->aTableLock = pTVar2;
    if (local_48->aTableLock == (TableLock *)0x0) {
      local_48->nTableLock = 0;
      sqlite3OomFault(local_48->db);
    }
    else {
      iVar1 = local_48->nTableLock;
      local_48->nTableLock = iVar1 + 1;
      pTVar2 = local_48->aTableLock + iVar1;
      pTVar2->iDb = iDb;
      pTVar2->iTab = iTab;
      pTVar2->isWriteLock = isWriteLock;
      pTVar2->zLockName = zName;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3TableLock(
  Parse *pParse,     /* Parsing context */
  int iDb,           /* Index of the database containing the table to lock */
  int iTab,          /* Root page number of the table to be locked */
  u8 isWriteLock,    /* True for a write lock */
  const char *zName  /* Name of the table to be locked */
){
  Parse *pToplevel = sqlite3ParseToplevel(pParse);
  int i;
  int nBytes;
  TableLock *p;
  assert( iDb>=0 );

  if( iDb==1 ) return;
  if( !sqlite3BtreeSharable(pParse->db->aDb[iDb].pBt) ) return;
  for(i=0; i<pToplevel->nTableLock; i++){
    p = &pToplevel->aTableLock[i];
    if( p->iDb==iDb && p->iTab==iTab ){
      p->isWriteLock = (p->isWriteLock || isWriteLock);
      return;
    }
  }

  nBytes = sizeof(TableLock) * (pToplevel->nTableLock+1);
  pToplevel->aTableLock =
      sqlite3DbReallocOrFree(pToplevel->db, pToplevel->aTableLock, nBytes);
  if( pToplevel->aTableLock ){
    p = &pToplevel->aTableLock[pToplevel->nTableLock++];
    p->iDb = iDb;
    p->iTab = iTab;
    p->isWriteLock = isWriteLock;
    p->zLockName = zName;
  }else{
    pToplevel->nTableLock = 0;
    sqlite3OomFault(pToplevel->db);
  }
}